

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::Set(CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  uint l_00;
  uint h_00;
  undefined4 *puVar3;
  uint h_local;
  uint l_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetLeaf *this_local;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2d7,"(level == 0)","level == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  l_00 = CharSetNode::leafIdx(l);
  h_00 = CharSetNode::leafIdx(h);
  CharBitvec::SetRange(&this->vec,l_00,h_00);
  bVar2 = CharBitvec::IsFull(&this->vec);
  this_local = this;
  if (bVar2) {
    FreeSelf(this,allocator);
    this_local = (CharSetLeaf *)&CharSetFull::Instance;
  }
  return &this_local->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        vec.SetRange(leafIdx(l), leafIdx(h));
        if (vec.IsFull())
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }